

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int dbg_print(int format,FILE *target,void *data,int len,int sep)

{
  uint in_ECX;
  char *in_RDX;
  FILE *in_RSI;
  undefined4 in_EDI;
  int in_R8D;
  int cents;
  int dollars;
  int local_28;
  
  switch(in_EDI) {
  case 0:
    if (columnar == 0) {
      fprintf(in_RSI,"%s",in_RDX);
    }
    else {
      fprintf(in_RSI,"%-*s",(ulong)in_ECX,in_RDX);
    }
    break;
  case 2:
    if (columnar == 0) {
      fprintf(in_RSI,"%ld",*(undefined8 *)in_RDX);
    }
    else {
      fprintf(in_RSI,"%12ld",*(undefined8 *)in_RDX);
    }
    break;
  case 3:
    fprintf(in_RSI,"%ld",*(undefined8 *)in_RDX);
    break;
  case 4:
    fprintf(in_RSI,"%ld",*(undefined8 *)in_RDX);
    break;
  case 5:
    local_28 = (int)*(undefined8 *)in_RDX;
    if (local_28 < 0) {
      fprintf(in_RSI,"-");
      local_28 = -local_28;
    }
    if (columnar == 0) {
      fprintf(in_RSI,"%d.%02d",(ulong)(uint)(local_28 / 100),(ulong)(uint)(local_28 % 100));
    }
    else {
      fprintf(in_RSI,"%12d.%02d",(ulong)(uint)(local_28 / 100),(ulong)(uint)(local_28 % 100));
    }
    break;
  case 6:
    if (columnar == 0) {
      fprintf(in_RSI,"%c",(ulong)(uint)(int)*in_RDX);
    }
    else {
      fprintf(in_RSI,"%c ",(ulong)(uint)(int)*in_RDX);
    }
  }
  if ((columnar == 0) && (in_R8D != -1)) {
    fprintf(in_RSI,"%c",0x7c);
  }
  return 0;
}

Assistant:

int
dbg_print(int format, FILE *target, void *data, int len, int sep)
{
	int dollars,
		cents;

	switch(format)
	{
	case DT_STR:
		if (columnar)
			/* Note: Columnar output cannot be in CSV format, */
			/* so there's no sense in quoting the string.     */
			fprintf(target, "%-*s", len, (char *)data);
		else
#ifdef DOUBLE_QUOTE_OUTPUT_STRINGS
			fprintf(target, "\"%s\"", (char *)data);
#else
			fprintf(target, "%s", (char *)data);
#endif
		break;
#ifdef MVS
	case DT_VSTR:
		/* note: only used in MVS, assumes columnar output */
		fprintf(target, "%c%c%-*s", 
			(len >> 8) & 0xFF, len & 0xFF, len, (char *)data);
		break;
#endif /* MVS */
	case DT_INT:
		if (columnar)
			fprintf(target, "%12ld", *(long *)data);
		else
			fprintf(target, "%ld", *(long *)data);
		break;
	case DT_HUGE:
		fprintf(target, HUGE_FORMAT, *(DSS_HUGE *)data);
		break;
	case DT_KEY:
		fprintf(target, "%ld", *(long *)data);
		break;
	case DT_MONEY:
		cents = *(long *)data;
		if (cents < 0)
			{
			fprintf(target, "-");
			cents = -cents;
			}
		dollars = cents / 100;
		cents %= 100;
		if (columnar)
			fprintf(target, "%12d.%02d", dollars, cents);
		else
			fprintf(target, "%d.%02d", dollars, cents);
		break;
	case DT_CHR:
		if (columnar)
			fprintf(target, "%c ", *(char *)data);
		else
			fprintf(target, "%c", *(char *)data);
		break;
	}

#ifdef EOL_HANDLING
	if (sep)
#endif /* EOL_HANDLING */
	if (!columnar && (sep != -1))
		fprintf(target, "%c", SEPARATOR);
	
	return(0);
}